

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::Initialize
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IMemoryAllocator *RawAllocator,PipelineResourceSignatureDesc *Desc,
          bool CreateImmutableSamplers,function<void_()> *InitResourceLayout,
          function<unsigned_long_()> *GetRequiredResourceCacheMemorySize,
          AllocResourceAttribsCallbackType *AllocResourceAttribs,
          AllocImmutableSamplerAttribsCallbackType *AllocImmutableSampler)

{
  STDDeleter<void,_Diligent::IMemoryAllocator> *this_00;
  ImmutableSamplerDesc *pIVar1;
  uint uVar2;
  PipelineResourceSignatureVkImpl *Signature;
  bool bVar3;
  PIPELINE_TYPE PipelineType;
  SHADER_TYPE SVar4;
  Uint32 UVar5;
  Uint32 ShaderVariableDataAllocatorCount;
  void *__p;
  reference pvVar6;
  Char *pCVar7;
  ShaderResourceCacheVk *pSVar8;
  ulong count;
  ShaderVariableManagerVk *pSVar9;
  RefCntAutoPtr<Diligent::SamplerVkImpl> *pRVar10;
  RenderDeviceVkImpl *pRVar11;
  ISampler **ppIVar12;
  char (*Args_1) [46];
  reference pvVar13;
  size_t sVar14;
  reference pvVar15;
  pointer ShaderVariableDataSizes_00;
  char (*Args_1_00) [9];
  ImmutableSamplerAttribsVk *local_258;
  PipelineResourceAttribsVk *local_228;
  unsigned_long local_1d8;
  size_t CacheMemorySize;
  undefined1 local_1c8 [2];
  SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes_1 [2];
  Uint32 s_1;
  array<unsigned_long,_6UL> ShaderVariableDataSizes;
  undefined1 local_190 [4];
  SHADER_TYPE ShaderType;
  string msg_3;
  uint local_168;
  Int8 Idx;
  Uint32 i;
  SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes [1];
  PipelineResourceSignatureImplType *pThisImpl;
  string msg_2;
  RefCntAutoPtr<Diligent::SamplerVkImpl> *pSampler;
  ImmutableSamplerDesc *ImtblSamDesc;
  Uint32 s;
  IRenderDevice *pDevice;
  reference_wrapper<Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>_>
  local_110;
  ResourceCacheContentType local_101;
  undefined1 local_100 [8];
  string msg_1;
  Uint32 idx;
  pair<unsigned_int,_unsigned_int> IdxRange;
  Uint32 VarType;
  string msg;
  unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> local_a8 [16];
  uint local_98;
  Uint32 NumStaticResStages;
  undefined1 local_88 [8];
  FixedLinearAllocator Allocator;
  function<unsigned_long_()> *GetRequiredResourceCacheMemorySize_local;
  function<void_()> *InitResourceLayout_local;
  bool CreateImmutableSamplers_local;
  PipelineResourceSignatureDesc *Desc_local;
  IMemoryAllocator *RawAllocator_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  Allocator._72_8_ = GetRequiredResourceCacheMemorySize;
  FixedLinearAllocator::FixedLinearAllocator((FixedLinearAllocator *)local_88,RawAllocator);
  ReserveSpaceForPipelineResourceSignatureDesc((FixedLinearAllocator *)local_88,Desc);
  FixedLinearAllocator::AddSpace<Diligent::PipelineResourceAttribsVk>
            ((FixedLinearAllocator *)local_88,(ulong)Desc->NumResources);
  local_98 = GetNumStaticResStages(this);
  if (local_98 != 0) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderResourceCacheVk>
              ((FixedLinearAllocator *)local_88,1);
    FixedLinearAllocator::AddSpace<Diligent::ShaderVariableManagerVk>
              ((FixedLinearAllocator *)local_88,(ulong)local_98);
  }
  FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerAttribsVk>
            ((FixedLinearAllocator *)local_88,(ulong)Desc->NumImmutableSamplers);
  if (CreateImmutableSamplers) {
    FixedLinearAllocator::AddSpace<Diligent::RefCntAutoPtr<Diligent::SamplerVkImpl>>
              ((FixedLinearAllocator *)local_88,(ulong)Desc->NumImmutableSamplers);
  }
  FixedLinearAllocator::Reserve((FixedLinearAllocator *)local_88);
  __p = FixedLinearAllocator::ReleaseOwnership((FixedLinearAllocator *)local_88);
  this_00 = (STDDeleter<void,_Diligent::IMemoryAllocator> *)((long)&msg.field_2 + 8);
  STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter(this_00,RawAllocator);
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>(local_a8,__p,this_00);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::operator=
            (&this->m_pRawMemory,
             (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_a8);
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
            ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)local_a8);
  CopyPipelineResourceSignatureDesc
            ((FixedLinearAllocator *)local_88,Desc,
             &(this->
              super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ).m_Desc,&this->m_ResourceOffsets);
  pvVar6 = std::array<unsigned_short,_4UL>::operator[](&this->m_ResourceOffsets,3);
  if ((uint)*pvVar6 !=
      (this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources) {
    FormatString<char[26],char[88]>
              ((string *)&IdxRange.second,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources"
               ,(char (*) [88])this);
    pCVar7 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar7,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x33d);
    std::__cxx11::string::~string((string *)&IdxRange.second);
  }
  for (IdxRange.first = 0; IdxRange.first < 3; IdxRange.first = IdxRange.first + 1) {
    register0x00000000 = GetResourceIndexRange(this,(SHADER_RESOURCE_VARIABLE_TYPE)IdxRange.first);
    for (msg_1.field_2._8_4_ = msg_1.field_2._12_4_; (uint)msg_1.field_2._8_4_ < idx;
        msg_1.field_2._8_4_ = msg_1.field_2._8_4_ + 1) {
      if ((this->
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
          ).m_Desc.Resources[(uint)msg_1.field_2._8_4_].VarType != IdxRange.first) {
        FormatString<char[29]>((string *)local_100,(char (*) [29])"Unexpected resource var type");
        pCVar7 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar7,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x342);
        std::__cxx11::string::~string((string *)local_100);
      }
    }
  }
  bVar3 = std::function::operator_cast_to_bool((function *)AllocResourceAttribs);
  if (bVar3) {
    local_228 = std::
                function<Diligent::PipelineResourceAttribsVk_*(Diligent::FixedLinearAllocator_&)>::
                operator()(AllocResourceAttribs,(FixedLinearAllocator *)local_88);
  }
  else {
    local_228 = FixedLinearAllocator::Allocate<Diligent::PipelineResourceAttribsVk>
                          ((FixedLinearAllocator *)local_88,(ulong)Desc->NumResources);
  }
  this->m_pResourceAttribs = local_228;
  if (local_98 != 0) {
    local_101 = Signature;
    pSVar8 = FixedLinearAllocator::
             Construct<Diligent::ShaderResourceCacheVk,Diligent::ResourceCacheContentType>
                       ((FixedLinearAllocator *)local_88,&local_101);
    this->m_pStaticResCache = pSVar8;
    count = (ulong)local_98;
    local_110 = std::ref<Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>>
                          (this);
    pDevice = (IRenderDevice *)std::ref<Diligent::ShaderResourceCacheVk>(this->m_pStaticResCache);
    pSVar9 = FixedLinearAllocator::
             ConstructArray<Diligent::ShaderVariableManagerVk,std::reference_wrapper<Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheVk>>
                       ((FixedLinearAllocator *)local_88,count,&local_110,
                        (reference_wrapper<Diligent::ShaderResourceCacheVk> *)&pDevice);
    this->m_StaticVarsMgrs = pSVar9;
  }
  bVar3 = std::function::operator_cast_to_bool((function *)AllocImmutableSampler);
  if (bVar3) {
    local_258 = (ImmutableSamplerAttribsVk *)
                std::function<void_*(Diligent::FixedLinearAllocator_&)>::operator()
                          (AllocImmutableSampler,(FixedLinearAllocator *)local_88);
  }
  else {
    local_258 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerAttribsVk>
                          ((FixedLinearAllocator *)local_88,(ulong)Desc->NumImmutableSamplers);
  }
  this->m_pImmutableSamplerAttribs = local_258;
  if (CreateImmutableSamplers) {
    pRVar10 = FixedLinearAllocator::ConstructArray<Diligent::RefCntAutoPtr<Diligent::SamplerVkImpl>>
                        ((FixedLinearAllocator *)local_88,(ulong)Desc->NumImmutableSamplers);
    this->m_pImmutableSamplers = pRVar10;
    bVar3 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            ::HasDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                       );
    if (bVar3) {
      pRVar11 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ::GetDevice(&this->
                             super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                           );
      for (ImtblSamDesc._4_4_ = 0; ImtblSamDesc._4_4_ < Desc->NumImmutableSamplers;
          ImtblSamDesc._4_4_ = ImtblSamDesc._4_4_ + 1) {
        pIVar1 = Desc->ImmutableSamplers;
        Args_1_00 = (char (*) [9])(ulong)ImtblSamDesc._4_4_;
        msg_2.field_2._8_8_ = this->m_pImmutableSamplers + (long)Args_1_00;
        ppIVar12 = RefCntAutoPtr<Diligent::SamplerVkImpl>::RawDblPtr<Diligent::ISampler,void>
                             ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)msg_2.field_2._8_8_);
        (**(code **)((long)(pRVar11->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                           ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                           super_ObjectBase<Diligent::IRenderDeviceVk>.
                           super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.
                           super_IRenderDevice.super_IObject + 0x38))
                  (pRVar11,&pIVar1[ImtblSamDesc._4_4_].Desc,ppIVar12);
        bVar3 = RefCntAutoPtr<Diligent::SamplerVkImpl>::operator!
                          ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)msg_2.field_2._8_8_);
        if (bVar3) {
          FormatString<char[26],char[9]>
                    ((string *)&pThisImpl,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pSampler",Args_1_00);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x364);
          std::__cxx11::string::~string((string *)&pThisImpl);
        }
      }
    }
  }
  std::function<void_()>::operator()(InitResourceLayout);
  _i = (PipelineResourceSignatureVkImpl *)this;
  if (local_98 != 0) {
    memset(&Idx,0,1);
    for (local_168 = 0;
        Args_1 = (char (*) [46])std::array<signed_char,_6UL>::size(&this->m_StaticResStageIndex),
        (char (*) [46])(ulong)local_168 < Args_1; local_168 = local_168 + 1) {
      pvVar13 = std::array<signed_char,_6UL>::operator[]
                          (&this->m_StaticResStageIndex,(ulong)local_168);
      msg_3.field_2._M_local_buf[0xf] = *pvVar13;
      if (-1 < msg_3.field_2._M_local_buf[0xf]) {
        if (local_98 <= (uint)(int)msg_3.field_2._M_local_buf[0xf]) {
          FormatString<char[26],char[46]>
                    ((string *)local_190,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"static_cast<Uint32>(Idx) < NumStaticResStages",Args_1);
          pCVar7 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar7,"Initialize",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                     ,0x375);
          std::__cxx11::string::~string((string *)local_190);
        }
        PipelineType = GetPipelineType(this);
        SVar4 = GetShaderTypeFromPipelineIndex(local_168,PipelineType);
        ShaderVariableManagerVk::Initialize
                  (this->m_StaticVarsMgrs + msg_3.field_2._M_local_buf[0xf],_i,RawAllocator,
                   (SHADER_RESOURCE_VARIABLE_TYPE *)&Idx,1,SVar4);
      }
    }
  }
  if (1 < Desc->SRBAllocationGranularity) {
    memset(local_1c8,0,0x30);
    for (CacheMemorySize._4_4_ = 0; uVar2 = CacheMemorySize._4_4_,
        UVar5 = GetNumActiveShaderStages(this), Signature = _i, uVar2 < UVar5;
        CacheMemorySize._4_4_ = CacheMemorySize._4_4_ + 1) {
      CacheMemorySize._2_2_ = 0x201;
      SVar4 = GetActiveShaderStageType(this,CacheMemorySize._4_4_);
      sVar14 = ShaderVariableManagerVk::GetRequiredMemorySize
                         (Signature,(SHADER_RESOURCE_VARIABLE_TYPE *)((long)&CacheMemorySize + 2),2,
                          SVar4,(Uint32 *)0x0);
      pvVar15 = std::array<unsigned_long,_6UL>::operator[]
                          ((array<unsigned_long,_6UL> *)local_1c8,(ulong)CacheMemorySize._4_4_);
      *pvVar15 = sVar14;
    }
    local_1d8 = std::function<unsigned_long_()>::operator()
                          ((function<unsigned_long_()> *)Allocator._72_8_);
    UVar5 = Desc->SRBAllocationGranularity;
    ShaderVariableDataAllocatorCount = GetNumActiveShaderStages(this);
    ShaderVariableDataSizes_00 =
         std::array<unsigned_long,_6UL>::data((array<unsigned_long,_6UL> *)local_1c8);
    SRBMemoryAllocator::Initialize
              (&this->m_SRBMemAllocator,UVar5,ShaderVariableDataAllocatorCount,
               ShaderVariableDataSizes_00,1,&local_1d8);
  }
  CalculateHash(&_i->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
  FixedLinearAllocator::~FixedLinearAllocator((FixedLinearAllocator *)local_88);
  return;
}

Assistant:

void Initialize(IMemoryAllocator&                               RawAllocator,
                    const PipelineResourceSignatureDesc&            Desc,
                    bool                                            CreateImmutableSamplers,
                    const std::function<void()>&                    InitResourceLayout,
                    const std::function<size_t()>&                  GetRequiredResourceCacheMemorySize,
                    const AllocResourceAttribsCallbackType&         AllocResourceAttribs  = nullptr,
                    const AllocImmutableSamplerAttribsCallbackType& AllocImmutableSampler = nullptr) noexcept(false)
    {
        FixedLinearAllocator Allocator{RawAllocator};

        ReserveSpaceForPipelineResourceSignatureDesc(Allocator, Desc);

        Allocator.AddSpace<PipelineResourceAttribsType>(Desc.NumResources);

        const Uint32 NumStaticResStages = GetNumStaticResStages();
        if (NumStaticResStages > 0)
        {
            Allocator.AddSpace<ShaderResourceCacheImplType>(1);
            Allocator.AddSpace<ShaderVariableManagerImplType>(NumStaticResStages);
        }

        Allocator.AddSpace<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            Allocator.AddSpace<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
        }

        Allocator.Reserve();
        // The memory is now owned by PipelineResourceSignatureBase and will be freed by Destruct().
        m_pRawMemory = decltype(m_pRawMemory){Allocator.ReleaseOwnership(), STDDeleterRawMem<void>{RawAllocator}};

        CopyPipelineResourceSignatureDesc(Allocator, Desc, this->m_Desc, m_ResourceOffsets);

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_ResourceOffsets[SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES] == this->m_Desc.NumResources);
        for (Uint32 VarType = 0; VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES; ++VarType)
        {
            const auto IdxRange = GetResourceIndexRange(static_cast<SHADER_RESOURCE_VARIABLE_TYPE>(VarType));
            for (Uint32 idx = IdxRange.first; idx < IdxRange.second; ++idx)
                VERIFY(this->m_Desc.Resources[idx].VarType == VarType, "Unexpected resource var type");
        }
#endif

        // Objects will be constructed by the specific implementation
        static_assert(std::is_trivially_destructible<PipelineResourceAttribsType>::value,
                      "PipelineResourceAttribsType objects must be constructed to be properly destructed in case an exception is thrown");
        m_pResourceAttribs = AllocResourceAttribs ?
            AllocResourceAttribs(Allocator) :
            Allocator.Allocate<PipelineResourceAttribsType>(Desc.NumResources);

        if (NumStaticResStages > 0)
        {
            m_pStaticResCache = Allocator.Construct<ShaderResourceCacheImplType>(ResourceCacheContentType::Signature);

            static_assert(std::is_nothrow_constructible<ShaderVariableManagerImplType, decltype(*this), ShaderResourceCacheImplType&>::value,
                          "Constructor of ShaderVariableManagerImplType must be noexcept, so we can safely construct all manager objects");
            m_StaticVarsMgrs = Allocator.ConstructArray<ShaderVariableManagerImplType>(NumStaticResStages, std::ref(*this), std::ref(*m_pStaticResCache));
        }

        m_pImmutableSamplerAttribs = AllocImmutableSampler ?
            static_cast<ImmutableSamplerAttribsType*>(AllocImmutableSampler(Allocator)) :
            Allocator.ConstructArray<ImmutableSamplerAttribsType>(Desc.NumImmutableSamplers);
        if (CreateImmutableSamplers)
        {
            m_pImmutableSamplers = Allocator.ConstructArray<RefCntAutoPtr<SamplerImplType>>(Desc.NumImmutableSamplers);
            if (this->HasDevice())
            {
                IRenderDevice* pDevice = this->GetDevice();
                for (Uint32 s = 0; s < Desc.NumImmutableSamplers; ++s)
                {
                    const ImmutableSamplerDesc&     ImtblSamDesc = Desc.ImmutableSamplers[s];
                    RefCntAutoPtr<SamplerImplType>& pSampler     = m_pImmutableSamplers[s];
                    pDevice->CreateSampler(ImtblSamDesc.Desc, pSampler.template RawDblPtr<ISampler>());
                    VERIFY_EXPR(pSampler);
                }
            }
        }

        InitResourceLayout();

        PipelineResourceSignatureImplType* const pThisImpl = static_cast<PipelineResourceSignatureImplType*>(this);

        if (NumStaticResStages > 0)
        {
            constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[] = {SHADER_RESOURCE_VARIABLE_TYPE_STATIC};
            for (Uint32 i = 0; i < m_StaticResStageIndex.size(); ++i)
            {
                Int8 Idx = m_StaticResStageIndex[i];
                if (Idx >= 0)
                {
                    VERIFY_EXPR(static_cast<Uint32>(Idx) < NumStaticResStages);
                    const SHADER_TYPE ShaderType = GetShaderTypeFromPipelineIndex(i, GetPipelineType());
                    m_StaticVarsMgrs[Idx].Initialize(*pThisImpl, RawAllocator, AllowedVarTypes, _countof(AllowedVarTypes), ShaderType);
                }
            }
        }

        if (Desc.SRBAllocationGranularity > 1)
        {
            std::array<size_t, MAX_SHADERS_IN_PIPELINE> ShaderVariableDataSizes = {};
            for (Uint32 s = 0; s < GetNumActiveShaderStages(); ++s)
            {
                constexpr SHADER_RESOURCE_VARIABLE_TYPE AllowedVarTypes[]{SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE, SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC};
                ShaderVariableDataSizes[s] = ShaderVariableManagerImplType::GetRequiredMemorySize(*pThisImpl, AllowedVarTypes, _countof(AllowedVarTypes), GetActiveShaderStageType(s));
            }

            const size_t CacheMemorySize = GetRequiredResourceCacheMemorySize();
            m_SRBMemAllocator.Initialize(Desc.SRBAllocationGranularity, GetNumActiveShaderStages(), ShaderVariableDataSizes.data(), 1, &CacheMemorySize);
        }

        pThisImpl->CalculateHash();
    }